

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNCodeBodyBase::fold_constants(CTPNCodeBodyBase *this,CTcPrsSymtab *param_2)

{
  _func_int **pp_Var1;
  CTcPrsNode *in_RDI;
  
  if (in_RDI[0xc].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[0xc].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    (**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RDI[10].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase);
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNCodeBodyBase::fold_constants(class CTcPrsSymtab *)
{
    /* 
     *   fold constants in our compound statement, in the scope of our
     *   local symbol table 
     */
    if (stm_ != 0)
        stm_->fold_constants(lcltab_);

    /* we are not directly changed by this operation */
    return this;
}